

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# riotUI.c
# Opt level: O3

void drawGuards(WINDOW *body,Map *map,UnitList *guards)

{
  char cVar1;
  int iVar2;
  int iVar3;
  UnitNode *pUVar4;
  
  pUVar4 = getHead(guards);
  iVar2 = *(int *)((long)pUVar4->unit + 4);
  getCoordinate::coordinates[0] = (iVar2 + -1) / 0x48;
  getCoordinate::coordinates[1] = getCoordinate::coordinates[0] * -0x48 + iVar2 + 1;
  cVar1 = *pUVar4->unit;
  iVar2 = wmove(body);
  if (iVar2 != -1) {
    waddch(body,(int)cVar1);
  }
  iVar2 = getLength(guards);
  if (3 < iVar2) {
    iVar2 = 1;
    do {
      pUVar4 = pUVar4->next;
      iVar3 = *(int *)((long)pUVar4->unit + 4);
      getCoordinate::coordinates[0] = (iVar3 + -1) / 0x48;
      getCoordinate::coordinates[1] = getCoordinate::coordinates[0] * -0x48 + iVar3 + 1;
      cVar1 = *pUVar4->unit;
      iVar3 = wmove(body);
      if (iVar3 != -1) {
        waddch(body,(int)cVar1);
      }
      iVar2 = iVar2 + 1;
      iVar3 = getLength(guards);
    } while (iVar2 < iVar3 + -2);
  }
  return;
}

Assistant:

void drawGuards(WINDOW *body, struct Map *map, struct UnitList *guards) {
    int *coordinates;
    int x;
    struct UnitNode *guardNode;
    struct Guard *guard;
    char type;
    guardNode = getHead(guards);
    guard = (struct Guard *) guardNode->unit;
    coordinates = getCoordinate(guard->position);
    type = guard->type;
    mvwaddch(body, coordinates[0], coordinates[1], type);
    for (x = 1; x < getLength(guards) - 2; x++) {
        guardNode = guardNode->next;
        guard = (struct Guard *) guardNode->unit;
        coordinates = getCoordinate(guard->position);
        type = guard->type;
        mvwaddch(body, coordinates[0], coordinates[1], type);
    }
}